

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

ColumnRef __thiscall clickhouse::ColumnString::Slice(ColumnString *this,size_t begin,size_t len)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t in_R8;
  ColumnRef CVar2;
  undefined1 local_39;
  ColumnString *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  SliceVector<std::__cxx11::string>
            (&local_28,(clickhouse *)(begin + 0x28),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)len,in_RCX,in_R8);
  local_38 = (ColumnString *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<clickhouse::ColumnString,std::allocator<clickhouse::ColumnString>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&_Stack_30,&local_38,(allocator<clickhouse::ColumnString> *)&local_39,&local_28);
  std::__shared_ptr<clickhouse::ColumnString,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<clickhouse::ColumnString,clickhouse::ColumnString>
            ((__shared_ptr<clickhouse::ColumnString,(__gnu_cxx::_Lock_policy)2> *)&local_38,local_38
            );
  _Var1._M_pi = _Stack_30._M_pi;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)local_38;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_38 = (ColumnString *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnString::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnString>(SliceVector(data_, begin, len));
}